

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatTest_U8StringViewLiteral_Test::TestBody(FormatTest_U8StringViewLiteral_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
  *expected;
  u8string_view uVar3;
  basic_string_view<fmt::v5::char8_t> bVar4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char8_t *data;
  AssertionResult gtest_ar;
  u8string_view s;
  size_t in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  char8_t *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  int line;
  char *in_stack_fffffffffffffea0;
  AssertionResult *this_00;
  Type in_stack_fffffffffffffeac;
  Type type;
  AssertHelper *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffec0;
  u8string_view *in_stack_fffffffffffffec8;
  Message *in_stack_fffffffffffffef8;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertHelper *this_01;
  AssertionResult local_c0 [2];
  undefined1 local_99;
  AssertionResult local_98 [2];
  undefined1 local_71;
  AssertionResult local_70;
  char8_t *local_60;
  undefined4 local_34;
  size_t local_30;
  AssertionResult local_28;
  basic_string_view<fmt::v5::char8_t> local_18;
  
  local_18 = (basic_string_view<fmt::v5::char8_t>)
             fmt::v5::literals::operator____u
                       ((char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                        in_stack_fffffffffffffe78);
  local_30 = fmt::v5::basic_string_view<fmt::v5::char8_t>::size(&local_18);
  local_34 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             (unsigned_long *)in_stack_fffffffffffffe88,
             (uint *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffec8 =
         (u8string_view *)testing::AssertionResult::failure_message((AssertionResult *)0x183604);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    testing::Message::~Message((Message *)0x183661);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1836b6);
  local_60 = fmt::v5::basic_string_view<fmt::v5::char8_t>::data(&local_18);
  local_71 = 0x61;
  testing::internal::EqHelper<false>::Compare<fmt::v5::char8_t,char>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffeb0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x183769);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    testing::Message::~Message((Message *)0x1837c6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x18381b);
  local_99 = 0x62;
  this_00 = local_98;
  testing::internal::EqHelper<false>::Compare<fmt::v5::char8_t,char>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeac);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffe98 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1838bc);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,type,&this_00->success_,
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    testing::Message::~Message((Message *)0x183919);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x183971);
  fmt::v5::literals::operator____u
            ((char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe78);
  uVar3 = fmt::v5::literals::operator____u
                    ((char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                     in_stack_fffffffffffffe78);
  this_01 = (AssertHelper *)uVar3.super_basic_string_view<fmt::v5::char8_t>.data_;
  fmt::v5::format<fmt::v5::u8string_view,fmt::v5::u8string_view>
            (in_stack_fffffffffffffec8,(u8string_view *)CONCAT17(uVar2,in_stack_fffffffffffffec0));
  bVar4 = (basic_string_view<fmt::v5::char8_t>)
          fmt::v5::literals::operator____u
                    ((char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                     in_stack_fffffffffffffe78);
  expected = (basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
              *)bVar4.size_;
  testing::internal::EqHelper<false>::
  Compare<std::__cxx11::basic_string<fmt::v5::char8_t,std::char_traits<fmt::v5::char8_t>,std::allocator<fmt::v5::char8_t>>,fmt::v5::u8string_view>
            (in_stack_fffffffffffffe98,(char *)bVar4.data_,expected,
             (u8string_view *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  line = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  std::__cxx11::
  basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
  ::~basic_string((basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
                   *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_c0);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x183ac7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,type,&this_00->success_,line,(char *)bVar4.data_);
    testing::internal::AssertHelper::operator=(this_01,(Message *)expected);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffe80));
    testing::Message::~Message((Message *)0x183b13);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x183b62);
  return;
}

Assistant:

TEST(FormatTest, U8StringViewLiteral) {
  using namespace fmt::literals;
  fmt::u8string_view s = "ab"_u;
  EXPECT_EQ(s.size(), 2u);
  const fmt::char8_t *data = s.data();
  EXPECT_EQ(data[0], 'a');
  EXPECT_EQ(data[1], 'b');
  EXPECT_EQ(format("{:*^5}"_u, "🤡"_u), "**🤡**"_u);
}